

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O1

int quicly_streambuf_create(quicly_stream_t *stream,size_t sz)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (sz < 0x48) {
    __assert_fail("sz >= sizeof(*sbuf)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0xd7,"int quicly_streambuf_create(quicly_stream_t *, size_t)");
  }
  if (stream->data == (void *)0x0) {
    puVar2 = (undefined8 *)malloc(sz);
    if (puVar2 == (undefined8 *)0x0) {
      iVar1 = 0x201;
    }
    else {
      puVar2[2] = 0;
      puVar2[3] = 0;
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2[4] = 0;
      puVar2[5] = "";
      puVar2[6] = 0;
      puVar2[7] = 0;
      *(undefined4 *)(puVar2 + 8) = 0;
      if (sz != 0x48) {
        memset(puVar2 + 9,0,sz - 0x48);
      }
      stream->data = puVar2;
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("stream->data == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                ,0xd8,"int quicly_streambuf_create(quicly_stream_t *, size_t)");
}

Assistant:

int quicly_streambuf_create(quicly_stream_t *stream, size_t sz)
{
    quicly_streambuf_t *sbuf;

    assert(sz >= sizeof(*sbuf));
    assert(stream->data == NULL);

    if ((sbuf = malloc(sz)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    quicly_sendbuf_init(&sbuf->egress);
    ptls_buffer_init(&sbuf->ingress, "", 0);
    if (sz != sizeof(*sbuf))
        memset((char *)sbuf + sizeof(*sbuf), 0, sz - sizeof(*sbuf));

    stream->data = sbuf;
    return 0;
}